

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMP_Agent.cpp
# Opt level: O2

void SNMPAgent::markTrapDeleted(SNMPTrap *trap)

{
  list<SNMPAgent_*,_std::allocator<SNMPAgent_*>_> *plVar1;
  iterator __end1;
  
  plVar1 = &agents_abi_cxx11_;
  while (plVar1 = (list<SNMPAgent_*,_std::allocator<SNMPAgent_*>_> *)
                  (plVar1->super__List_base<SNMPAgent_*,_std::allocator<SNMPAgent_*>_>)._M_impl.
                  _M_node.super__List_node_base._M_next, plVar1 != &agents_abi_cxx11_) {
    mark_trap_deleted((list<InformItem_*,_std::allocator<InformItem_*>_> *)
                      (*(long *)((long)plVar1 + 0x10) + 0x648),trap);
  }
  return;
}

Assistant:

void SNMPAgent::markTrapDeleted(SNMPTrap* trap){
    for(auto agent : SNMPAgent::agents){
        mark_trap_deleted(agent->informList, trap);
    }
}